

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_gen_keys.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint64_t unaff_retaddr;
  size_t i;
  uint64_t q;
  uint64_t se;
  uint64_t sk;
  size_t n;
  ulp_ring_private_key *priv_key;
  ulp_ring_public_key *pub_key;
  ulong local_40;
  ulong uVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint in_stack_fffffffffffffff8;
  
  puVar4 = (ulong *)0x0;
  puVar3 = (ulong *)0x0;
  uVar2 = 0x100;
  iVar1 = ulp_ring_generate_key_pair
                    (i,unaff_retaddr,(ulong)in_stack_fffffffffffffff8,0,(ulp_ring_public_key **)0x0,
                     (ulp_ring_private_key **)0x100);
  if ((((((iVar1 == 0) && (puVar4 != (ulong *)0x0)) && (*puVar4 == uVar2)) &&
       (((puVar4[1] == 0x3f8c027d93dd95 && (puVar4[2] == 0x1fe2f37)) &&
        ((puVar4[3] != 0 && ((puVar4[4] != 0 && (puVar3 != (ulong *)0x0)))))))) &&
      (*puVar3 == uVar2)) && ((puVar3[1] == 0x3f8c027d93dd95 && (puVar3[2] != 0)))) {
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      if (((0x3f8c027d93dd94 < *(ulong *)(puVar4[3] + local_40 * 8)) ||
          (0x3f8c027d93dd94 < *(ulong *)(puVar4[4] + local_40 * 8))) ||
         (0x1da7d < *(ulong *)(puVar3[2] + local_40 * 8))) goto LAB_00101333;
    }
    ulp_ring_free_public_key((ulp_ring_public_key *)0x10131f);
    ulp_ring_free_private_key((ulp_ring_private_key *)0x101329);
    iVar1 = 0;
  }
  else {
LAB_00101333:
    ulp_ring_free_public_key((ulp_ring_public_key *)0x10133d);
    ulp_ring_free_private_key((ulp_ring_private_key *)0x101347);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main() {

    ulp_ring_public_key* pub_key = NULL;
    ulp_ring_private_key* priv_key = NULL;

    size_t n = 256;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_ring_generate_key_pair(n, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->q != q || pub_key->se != se || pub_key->a == NULL || pub_key->p == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->q != q || priv_key->s == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n; i++) {
        if(pub_key->a[i] >= q || pub_key->p[i] >= q || priv_key->s[i] >= sk)
            goto error;
    }

    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    return 0;


    error:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        return 1;

}